

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

NamespaceAliasDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&>
          (PoolAllocator *this,Context *args,Identifier *args_1,QualifiedIdentifier *args_2,
          CommaSeparatedList *args_3)

{
  Identifier *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_65 [13];
  pool_ptr<soul::AST::Expression> local_58;
  pool_ptr<soul::AST::Expression> local_50;
  Identifier local_48;
  NamespaceAliasDeclaration *local_40;
  NamespaceAliasDeclaration *newObject;
  PoolItem *newItem;
  CommaSeparatedList *args_local_3;
  QualifiedIdentifier *args_local_2;
  Identifier *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_3;
  args_local_3 = (CommaSeparatedList *)args_2;
  args_local_2 = (QualifiedIdentifier *)args_1;
  args_local_1 = (Identifier *)args;
  args_local = (Context *)this;
  newObject = (NamespaceAliasDeclaration *)allocateSpaceForObject(this,0x48);
  c = args_local_1;
  this_00 = &(newObject->super_ASTObject).context;
  local_48.name =
       (string *)(args_local_2->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject;
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::QualifiedIdentifier,void>
            (&local_50,(QualifiedIdentifier *)args_local_3);
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::CommaSeparatedList,void>
            (&local_58,(CommaSeparatedList *)newItem);
  AST::NamespaceAliasDeclaration::NamespaceAliasDeclaration
            ((NamespaceAliasDeclaration *)this_00,(Context *)c,local_48,&local_50,&local_58);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_58);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_50);
  local_40 = (NamespaceAliasDeclaration *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::Identifier&&,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_65);
  *(DestructorFn **)&(newObject->super_ASTObject).objectType = pDVar1;
  return local_40;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }